

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fUniformApiTests.cpp
# Opt level: O2

UniformCollection *
deqp::gles3::Functional::anon_unknown_1::UniformCollection::basicStruct
          (DataType type0,DataType type1,bool containsArrays,char *nameSuffix)

{
  UniformCollection *this;
  StructType *this_00;
  undefined7 in_register_00000011;
  Precision precision;
  Precision precision_00;
  allocator<char> local_cd;
  undefined4 local_cc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  Uniform local_a8;
  ulong local_70;
  VarType local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_cc = (undefined4)CONCAT71(in_register_00000011,containsArrays);
  this = (UniformCollection *)operator_new(0x30);
  (this->m_uniforms).
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_uniforms).
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_uniforms).
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_structTypes).
  super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_structTypes).
  super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_structTypes).
  super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_70 = (ulong)type1;
  this_00 = (StructType *)operator_new(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"structType",(allocator<char> *)&local_50);
  std::operator+(&local_a8.name,&local_c8,glcts::fixed_sample_locations_values + 1);
  glu::StructType::StructType(this_00,local_a8.name._M_dataplus._M_p);
  precision = (uint)(type0 - TYPE_BOOL < 4) * 2 + PRECISION_MEDIUMP;
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  glu::VarType::VarType((VarType *)&local_a8,type0,precision);
  glu::StructType::addMember(this_00,"m0",(VarType *)&local_a8);
  precision_00 = (uint)(type1 - TYPE_BOOL < 4) * 2 + PRECISION_MEDIUMP;
  glu::VarType::~VarType((VarType *)&local_a8);
  glu::VarType::VarType((VarType *)&local_a8,(DataType)local_70,precision_00);
  glu::StructType::addMember(this_00,"m1",(VarType *)&local_a8);
  glu::VarType::~VarType((VarType *)&local_a8);
  if ((char)local_cc != '\0') {
    glu::VarType::VarType((VarType *)&local_c8,type0,precision);
    glu::VarType::VarType((VarType *)&local_a8,(VarType *)&local_c8,3);
    glu::StructType::addMember(this_00,"m2",(VarType *)&local_a8);
    glu::VarType::~VarType((VarType *)&local_a8);
    glu::VarType::~VarType((VarType *)&local_c8);
    glu::VarType::VarType((VarType *)&local_c8,(DataType)local_70,precision_00);
    glu::VarType::VarType((VarType *)&local_a8,(VarType *)&local_c8,3);
    glu::StructType::addMember(this_00,"m3",(VarType *)&local_a8);
    glu::VarType::~VarType((VarType *)&local_a8);
    glu::VarType::~VarType((VarType *)&local_c8);
  }
  addStructType(this,this_00);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"u_var",&local_cd);
  std::operator+(&local_c8,&local_50,glcts::fixed_sample_locations_values + 1);
  glu::VarType::VarType(&local_68,this_00);
  anon_unknown_1::Uniform::Uniform(&local_a8,local_c8._M_dataplus._M_p,&local_68);
  addUniform(this,&local_a8);
  anon_unknown_1::Uniform::~Uniform(&local_a8);
  glu::VarType::~VarType(&local_68);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_50);
  return this;
}

Assistant:

static UniformCollection* basicStruct (const glu::DataType type0, const glu::DataType type1, const bool containsArrays, const char* const nameSuffix = "")
	{
		UniformCollection* const	res		= new UniformCollection;
		const glu::Precision		prec0	= glu::isDataTypeBoolOrBVec(type0) ? glu::PRECISION_LAST : glu::PRECISION_MEDIUMP;
		const glu::Precision		prec1	= glu::isDataTypeBoolOrBVec(type1) ? glu::PRECISION_LAST : glu::PRECISION_MEDIUMP;

		StructType* const structType = new StructType((string("structType") + nameSuffix).c_str());
		structType->addMember("m0", glu::VarType(type0, prec0));
		structType->addMember("m1", glu::VarType(type1, prec1));
		if (containsArrays)
		{
			structType->addMember("m2", glu::VarType(glu::VarType(type0, prec0), 3));
			structType->addMember("m3", glu::VarType(glu::VarType(type1, prec1), 3));
		}

		res->addStructType(structType);
		res->addUniform(Uniform((string("u_var") + nameSuffix).c_str(), glu::VarType(structType)));

		return res;
	}